

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::ExceptionBreakpointsFilter>::construct
          (BasicTypeInfo<dap::ExceptionBreakpointsFilter> *this,void *ptr)

{
  memset((void *)((long)ptr + 0x10),0,0x90);
  *(void **)ptr = (void *)((long)ptr + 0x10);
  *(undefined8 *)((long)ptr + 8) = 0;
  *(undefined1 *)((long)ptr + 0x20) = 0;
  *(undefined1 *)((long)ptr + 0x29) = 0;
  *(long *)((long)ptr + 0x30) = (long)ptr + 0x40;
  *(undefined1 *)((long)ptr + 0x40) = 0;
  *(long *)((long)ptr + 0x58) = (long)ptr + 0x68;
  *(undefined1 *)((long)ptr + 0x68) = 0;
  *(long *)((long)ptr + 0x78) = (long)ptr + 0x88;
  *(undefined1 *)((long)ptr + 0x88) = 0;
  *(undefined1 *)((long)ptr + 0x99) = 0;
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }